

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O0

void archive_string_conversion_set_opt(archive_string_conv *sc,wchar_t opt)

{
  int in_ESI;
  long in_RDI;
  
  if (in_ESI != 1) {
    if (in_ESI == 2) {
      if ((*(uint *)(in_RDI + 0x24) & 0x40) == 0) {
        *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) | 0x40;
        *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) & 0xffffff7f;
        setup_converter((archive_string_conv *)0x16cbf3);
      }
    }
    else if (((in_ESI == 4) &&
             ((((*(uint *)(in_RDI + 0x24) & 8) != 0 || ((*(uint *)(in_RDI + 0x24) & 0x2a00) == 0))
              || ((*(uint *)(in_RDI + 0x24) & 0x1500) != 0)))) &&
            ((*(uint *)(in_RDI + 0x24) & 0x80) == 0)) {
      *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) | 0x80;
      *(uint *)(in_RDI + 0x24) = *(uint *)(in_RDI + 0x24) & 0xffffffbf;
      setup_converter((archive_string_conv *)0x16cc66);
    }
  }
  return;
}

Assistant:

void
archive_string_conversion_set_opt(struct archive_string_conv *sc, int opt)
{
	switch (opt) {
	/*
	 * A filename in UTF-8 was made with libarchive 2.x in a wrong
	 * assumption that wchar_t was Unicode.
	 * This option enables simulating the assumption in order to read
	 * that filname correctly.
	 */
	case SCONV_SET_OPT_UTF8_LIBARCHIVE2X:
#if (defined(_WIN32) && !defined(__CYGWIN__)) \
	 || defined(__STDC_ISO_10646__) || defined(__APPLE__)
		/*
		 * Nothing to do for it since wchar_t on these platforms
		 * is really Unicode.
		 */
		(void)sc; /* UNUSED */
#else
		if ((sc->flag & SCONV_UTF8_LIBARCHIVE_2) == 0) {
			sc->flag |= SCONV_UTF8_LIBARCHIVE_2;
			/* Set up string converters. */
			setup_converter(sc);
		}
#endif
		break;
	case SCONV_SET_OPT_NORMALIZATION_C:
		if ((sc->flag & SCONV_NORMALIZATION_C) == 0) {
			sc->flag |= SCONV_NORMALIZATION_C;
			sc->flag &= ~SCONV_NORMALIZATION_D;
			/* Set up string converters. */
			setup_converter(sc);
		}
		break;
	case SCONV_SET_OPT_NORMALIZATION_D:
#if defined(HAVE_ICONV)
		/*
		 * If iconv will take the string, do not change the
		 * setting of the normalization.
		 */
		if (!(sc->flag & SCONV_WIN_CP) &&
		     (sc->flag & (SCONV_FROM_UTF16 | SCONV_FROM_UTF8)) &&
		    !(sc->flag & (SCONV_TO_UTF16 | SCONV_TO_UTF8)))
			break;
#endif
		if ((sc->flag & SCONV_NORMALIZATION_D) == 0) {
			sc->flag |= SCONV_NORMALIZATION_D;
			sc->flag &= ~SCONV_NORMALIZATION_C;
			/* Set up string converters. */
			setup_converter(sc);
		}
		break;
	default:
		break;
	}
}